

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
ImageT<unsigned_char,_1U>::resample
          (ImageT<unsigned_char,_1U> *this,uint32_t targetWidth,uint32_t targetHeight,char *filter,
          float filterScale,Boundary_Op wrapMode)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  Color *pCVar4;
  uint uVar5;
  _Head_base<0UL,_basisu::Resampler_*,_false> this_00;
  _Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_> _Var6;
  char cVar7;
  anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3 aVar8;
  ImageT<unsigned_char,_1U> *this_01;
  Resampler *this_02;
  long lVar9;
  runtime_error *this_03;
  uint uVar10;
  int iVar11;
  uint32_t sourceX;
  int iVar12;
  ulong uVar13;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar14;
  pointer __p;
  uint32_t targetX;
  ulong uVar15;
  uint h;
  __uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *p_Var16;
  bool bVar17;
  undefined4 uVar18;
  float fVar19;
  string_view fmt;
  format_args args;
  array<std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>,_1UL> resamplers
  ;
  array<std::vector<float,_std::allocator<float>_>,_1UL> samples;
  TransferFunctionSRGB tfSRGB;
  TransferFunctionLinear tfLinear;
  _Head_base<0UL,_basisu::Resampler_*,_false> local_b8 [3];
  char *local_a0;
  long local_98;
  int local_90;
  int local_8c;
  string local_88;
  long local_60;
  __uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_> local_58;
  _Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_> local_50;
  ulong local_48;
  ulong local_40;
  __uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_> local_38;
  
  local_a0 = (char *)CONCAT44(in_register_00000084,wrapMode);
  lVar9 = CONCAT44(in_register_00000034,targetWidth);
  aVar14 = in_R9;
  this_01 = (ImageT<unsigned_char,_1U> *)operator_new(0x28);
  h = (uint)filter;
  ImageT(this_01,targetHeight,h);
  uVar3 = *(undefined8 *)(lVar9 + 0x10);
  (this_01->super_Image).transferFunction = (int)uVar3;
  (this_01->super_Image).primaries = (int)((ulong)uVar3 >> 0x20);
  if ((h != 0) && (targetHeight != 0)) {
    uVar1 = *(uint *)(lVar9 + 8);
    if ((uVar1 != 0) && (uVar2 = *(uint *)(lVar9 + 0xc), uVar2 != 0)) {
      uVar5 = uVar2;
      if (uVar2 < uVar1) {
        uVar5 = uVar1;
      }
      uVar10 = h;
      if (h < targetHeight) {
        uVar10 = targetHeight;
      }
      local_60 = lVar9;
      local_50.super__Head_base<0UL,_Image_*,_false>._M_head_impl =
           (_Head_base<0UL,_Image_*,_false>)(_Head_base<0UL,_Image_*,_false>)this;
      if ((uVar10 < 0x4001) && (uVar5 < 0x4001)) {
        local_88._M_dataplus._M_p = (pointer)0x0;
        local_88._M_string_length = 0;
        local_88.field_2._M_allocated_capacity = 0;
        local_b8[0]._M_head_impl = (Resampler *)0x0;
        this_02 = (Resampler *)operator_new(0x78);
        basisu::Resampler::Resampler
                  (this_02,uVar1,uVar2,targetHeight,h,in_R9._0_4_,0.0,1.0,local_a0,
                   (Contrib_List *)0x0,(Contrib_List *)0x0,filterScale,filterScale,0.0,0.0);
        this_00._M_head_impl = local_b8[0]._M_head_impl;
        local_58._M_t.
        super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
        super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
             (tuple<basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>)
             (_Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>)0x0;
        bVar17 = local_b8[0]._M_head_impl != (Resampler *)0x0;
        local_b8[0]._M_head_impl = this_02;
        if (bVar17) {
          basisu::Resampler::~Resampler(this_00._M_head_impl);
          operator_delete(this_00._M_head_impl,0x78);
        }
        std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                  ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                   &local_58);
        checkResamplerStatus(local_b8[0]._M_head_impl,local_a0);
        lVar9 = local_60;
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)&local_88,(ulong)uVar1);
        local_58._M_t.
        super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
        super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
             (tuple<basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>)
             &PTR_encode_0025f8d0;
        local_38._M_t.
        super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>.
        super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl =
             (tuple<basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>)
             &PTR_encode_0025f928;
        p_Var16 = &local_58;
        if (*(int *)(lVar9 + 0x10) != 2) {
          p_Var16 = &local_38;
        }
        local_40 = (ulong)uVar1;
        local_48 = 1;
        if (1 < uVar1) {
          local_48 = (ulong)uVar1;
        }
        local_90 = uVar2 + (uVar2 == 0);
        local_98 = 0;
        iVar12 = 0;
        iVar11 = 0;
        do {
          uVar15 = local_48;
          uVar13 = 0;
          local_8c = iVar11;
          do {
            uVar18 = (**(code **)((((__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                     *)&(p_Var16->_M_t).
                                        super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                                   )->_M_t).
                                  super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                                  .super__Head_base<0UL,_basisu::Resampler_*,_false>._M_head_impl +
                                 8))((float)*(byte *)(*(long *)(lVar9 + 0x18) +
                                                     (ulong)(uint)((int)local_98 + (int)uVar13)) *
                                     0.003921569,p_Var16);
            *(undefined4 *)(local_88._M_dataplus._M_p + uVar13 * 4) = uVar18;
            uVar13 = uVar13 + 1;
          } while (uVar15 != uVar13);
          cVar7 = basisu::Resampler::put_line((float *)local_b8[0]._M_head_impl);
          if (cVar7 == '\0') {
            checkResamplerStatus(local_b8[0]._M_head_impl,local_a0);
          }
          do {
            lVar9 = basisu::Resampler::get_line();
            if (lVar9 != 0) {
              uVar15 = 0;
              do {
                pCVar4 = this_01->pixels;
                fVar19 = (float)(**(code **)(((__uniq_ptr_impl<basisu::Resampler,_std::default_delete<basisu::Resampler>_>
                                               *)&(p_Var16->_M_t).
                                                  super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                                             )->_M_t).
                                            super__Tuple_impl<0UL,_basisu::Resampler_*,_std::default_delete<basisu::Resampler>_>
                                            .super__Head_base<0UL,_basisu::Resampler_*,_false>.
                                            _M_head_impl)
                                          (*(undefined4 *)(lVar9 + uVar15 * 4),p_Var16);
                if (0.0 <= fVar19) {
                  aVar8 = (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)0xff;
                  if (fVar19 <= 1.0) {
                    aVar8 = SUB41((int)(fVar19 * 255.0 + 0.5),0);
                  }
                }
                else {
                  aVar8 = (anon_union_1_2_6556a7fb_for_color<unsigned_char,_1U>_3)0x0;
                }
                pCVar4[iVar12 * targetHeight + (int)uVar15].field_0 = aVar8;
                uVar15 = uVar15 + 1;
              } while (targetHeight + (targetHeight == 0) != uVar15);
              iVar12 = iVar12 + 1;
            }
            _Var6.super__Head_base<0UL,_Image_*,_false>._M_head_impl =
                 local_50.super__Head_base<0UL,_Image_*,_false>._M_head_impl;
          } while (lVar9 != 0);
          iVar11 = local_8c + 1;
          local_98 = local_98 + local_40;
          lVar9 = local_60;
        } while (iVar11 != local_90);
        *(ImageT<unsigned_char,_1U> **)local_50.super__Head_base<0UL,_Image_*,_false>._M_head_impl =
             this_01;
        std::unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_>::~unique_ptr
                  ((unique_ptr<basisu::Resampler,_std::default_delete<basisu::Resampler>_> *)
                   local_b8);
        if (local_88._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_88._M_dataplus._M_p,
                          local_88.field_2._M_allocated_capacity - (long)local_88._M_dataplus._M_p);
        }
        return (unique_ptr<Image,_std::default_delete<Image>_>)
               _Var6.super__Head_base<0UL,_Image_*,_false>._M_head_impl;
      }
      this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_b8[0]._M_head_impl = (Resampler *)0x4000;
      fmt.size_ = 1;
      fmt.data_ = (char *)0x2a;
      args.field_1.args_ = aVar14.args_;
      args.desc_ = (unsigned_long_long)local_b8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_88,(v10 *)"Image larger than max supported size of {}",fmt,args);
      std::runtime_error::runtime_error(this_03,(string *)&local_88);
      __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __assert_fail("sourceWidth && sourceHeight && targetWidth && targetHeight",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x461,
                "virtual std::unique_ptr<Image> ImageT<unsigned char, 1>::resample(uint32_t, uint32_t, const char *, float, basisu::Resampler::Boundary_Op) [componentType = unsigned char, componentCount = 1]"
               );
}

Assistant:

virtual std::unique_ptr<Image> resample(uint32_t targetWidth, uint32_t targetHeight,
            const char* filter, float filterScale, basisu::Resampler::Boundary_Op wrapMode) override {
        using namespace basisu;

        auto target = std::make_unique<ImageT<componentType, componentCount>>(targetWidth, targetHeight);
        target->setTransferFunction(transferFunction);
        target->setPrimaries(primaries);

        const auto sourceWidth = width;
        const auto sourceHeight = height;
        assert(sourceWidth && sourceHeight && targetWidth && targetHeight);

        if (std::max(sourceWidth, sourceHeight) > BASISU_RESAMPLER_MAX_DIMENSION ||
                std::max(targetWidth, targetHeight) > BASISU_RESAMPLER_MAX_DIMENSION) {
            throw std::runtime_error(fmt::format(
                    "Image larger than max supported size of {}", BASISU_RESAMPLER_MAX_DIMENSION));
        }

        std::array<std::vector<float>, componentCount> samples;
        std::array<std::unique_ptr<Resampler>, componentCount> resamplers;

        // Float types handled as SFloat HDR otherwise UNROM LDR is assumed
        const auto isHDR = std::is_floating_point_v<componentType>;

        for (uint32_t i = 0; i < componentCount; ++i) {
            resamplers[i] = std::make_unique<Resampler>(
                    sourceWidth, sourceHeight,
                    targetWidth, targetHeight,
                    wrapMode,
                    0.0f, isHDR ? 0.0f : 1.0f,
                    filter,
                    i == 0 ? nullptr : resamplers[0]->get_clist_x(),
                    i == 0 ? nullptr : resamplers[0]->get_clist_y(),
                    filterScale, filterScale,
                    0.f, 0.f);
            checkResamplerStatus(*resamplers[i], filter);
            samples[i].resize(sourceWidth);
        }

        const TransferFunctionSRGB tfSRGB;
        const TransferFunctionLinear tfLinear;
        const TransferFunction& tf = transferFunction == KHR_DF_TRANSFER_SRGB ?
                static_cast<const TransferFunction&>(tfSRGB) :
                static_cast<const TransferFunction&>(tfLinear);

        uint32_t targetY = 0;
        for (uint32_t sourceY = 0; sourceY < sourceHeight; ++sourceY) {
            // Put source lines into resampler(s)
            for (uint32_t sourceX = 0; sourceX < sourceWidth; ++sourceX) {
                const auto& sourcePixel = pixels[sourceY * sourceWidth + sourceX];
                for (uint32_t c = 0; c < componentCount; ++c) {
                    const float value = std::is_floating_point_v<componentType> ?
                            sourcePixel[c] :
                            static_cast<float>(sourcePixel[c]) * (1.f / static_cast<float>(Color::one()));

                    // c == 3: Alpha channel always uses tfLinear
                    samples[c][sourceX] = (c == 3 ? tfLinear : tf).decode(value);
                }
            }

            for (uint32_t c = 0; c < componentCount; ++c)
                if (!resamplers[c]->put_line(&samples[c][0]))
                    checkResamplerStatus(*resamplers[c], filter);

            // Retrieve any output lines
            while (true) {
                std::array<const float*, componentCount> outputLine{nullptr};
                for (uint32_t c = 0; c < componentCount; ++c)
                    outputLine[c] = resamplers[c]->get_line();

                if (outputLine[0] == nullptr)
                    break; // No new output line, break from retrieve and place in a new source line

                for (uint32_t targetX = 0; targetX < targetWidth; ++targetX) {
                    Color& targetPixel = target->pixels[targetY * targetWidth + targetX];
                    for (uint32_t c = 0; c < componentCount; ++c) {
                        const auto linearValue = outputLine[c][targetX];

                        // c == 3: Alpha channel always uses tfLinear
                        const float outValue = (c == 3 ? tfLinear : tf).encode(linearValue);
                        if constexpr (std::is_floating_point_v<componentType>) {
                            targetPixel[c] = outValue;
                        } else {
                            const auto unormValue =
                                std::isnan(outValue) ? componentType{0} :
                                outValue < 0.f ? componentType{0} :
                                outValue > 1.f ? Color::one() :
                                static_cast<componentType>(outValue * static_cast<float>(Color::one()) + 0.5f);
                            targetPixel[c] = unormValue;
                        }
                    }
                }

                ++targetY;
            }
        }

        return target;
    }